

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O3

ostream * tvm::runtime::operator<<(ostream *os,DLDataType t)

{
  uint uVar1;
  size_t sVar2;
  ostream *poVar3;
  uint8_t type_code;
  char *__s;
  uint uVar4;
  uint uVar5;
  LogMessageFatal local_1b0;
  
  uVar1 = (uint)t >> 0x10;
  uVar4 = (uint)t >> 8 & 0xff;
  uVar5 = (uint)t & 0xff;
  if (((uVar1 == 1) && (uVar5 == 1)) && (uVar4 == 1)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"bool",4);
  }
  else {
    if (uVar5 < 0x81) {
      if (t.code < 0xe) {
        __s = *(char **)(&DAT_0023e638 + (ulong)((uint)t & 0xf) * 8);
      }
      else {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/include/tvm/runtime/packed_func.h"
                   ,0x3f6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"unknown type_code=",0x12);
        std::ostream::operator<<((ostream *)&local_1b0,uVar5);
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
        __s = "";
      }
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      if (uVar5 == 3) {
        return os;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,"custom[",7);
      GetCustomTypeName_abi_cxx11_
                ((string *)&local_1b0,(runtime *)(ulong)((uint)t & 0xff),type_code);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)CONCAT71(local_1b0._1_7_,local_1b0.log_stream_),local_1b0._8_8_
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      if ((undefined1 *)CONCAT71(local_1b0._1_7_,local_1b0.log_stream_) != &local_1b0.field_0x10) {
        operator_delete((undefined1 *)CONCAT71(local_1b0._1_7_,local_1b0.log_stream_));
      }
    }
    std::ostream::operator<<((ostream *)os,uVar4);
    if (uVar1 != 1) {
      local_1b0.log_stream_ = (ostringstream)0x78;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_1b0,1);
      std::ostream::operator<<((ostream *)poVar3,uVar1);
    }
  }
  return os;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, DLDataType t) {  // NOLINT(*)
  if (t.bits == 1 && t.lanes == 1 && t.code == kDLUInt) {
    os << "bool"; return os;
  }
  if (t.code < kTVMCustomBegin) {
    os << TypeCode2Str(t.code);
  } else {
    os << "custom[" << GetCustomTypeName(t.code) << "]";
  }
  if (t.code == kTVMOpaqueHandle) return os;
  os << static_cast<int>(t.bits);
  if (t.lanes != 1) {
    os << 'x' << static_cast<int>(t.lanes);
  }
  return os;
}